

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

void __thiscall Pl_Flate::handleData(Pl_Flate *this,uchar *data,size_t len,int flush)

{
  unsigned_long uVar1;
  uint uVar2;
  int iVar3;
  runtime_error *prVar4;
  pointer pMVar5;
  Pipeline *pPVar6;
  element_type *peVar7;
  unsigned_long local_60;
  unsigned_long local_58;
  uLong ready;
  int local_48;
  int iStack_44;
  bool done;
  int err;
  int err_1;
  z_stream *zstream;
  int local_24;
  size_t sStack_20;
  int flush_local;
  size_t len_local;
  uchar *data_local;
  Pl_Flate *this_local;
  
  local_24 = flush;
  sStack_20 = len;
  len_local = (size_t)data;
  data_local = (uchar *)this;
  if (0xffffffff < len) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Pl_Flate: zlib doesn\'t support data blocks larger than int");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                     (&this->m);
  _err = (size_t *)pMVar5->zdata;
  *_err = len_local;
  uVar2 = QIntC::to_uint<unsigned_long>(&stack0xffffffffffffffe0);
  *(uint *)(_err + 1) = uVar2;
  pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                     (&this->m);
  if ((pMVar5->initialized & 1U) == 0) {
    iStack_44 = 0;
    pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                       (&this->m);
    if (pMVar5->action == a_deflate) {
      iStack_44 = deflateInit_(_err,compression_level,"1.2.11",0x70);
    }
    else {
      iStack_44 = inflateInit_(_err,"1.2.11",0x70);
    }
    checkError(this,"Init",iStack_44);
    pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                       (&this->m);
    pMVar5->initialized = true;
  }
  local_48 = 0;
  ready._7_1_ = 0;
  do {
    while( true ) {
      while( true ) {
        if (((ready._7_1_ ^ 0xff) & 1) == 0) {
          return;
        }
        pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        if (pMVar5->action == a_deflate) {
          local_48 = deflate(_err,local_24);
        }
        else {
          local_48 = inflate(_err,local_24);
        }
        pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        if ((((pMVar5->action == a_inflate) && (local_48 != 0)) && (_err[6] != 0)) &&
           (iVar3 = strcmp((char *)_err[6],"incorrect data check"), iVar3 == 0)) {
          local_48 = 1;
        }
        if (local_48 != -5) break;
        warn(this,"input stream is complete but output may still be valid",-5);
        ready._7_1_ = 1;
      }
      if (local_48 != 0) break;
LAB_0014e26e:
      if (((int)_err[1] == 0) && ((int)_err[4] != 0)) {
        ready._7_1_ = 1;
      }
      pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
               operator->(&this->m);
      local_60 = pMVar5->out_bufsize - (ulong)(uint)_err[4];
      local_58 = QIntC::to_ulong<unsigned_long>(&local_60);
      if (local_58 != 0) {
        if (((anonymous_namespace)::memory_limit_ != 0) &&
           (pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                     operator->(&this->m), uVar1 = local_58, pMVar5->action != a_deflate)) {
          pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                   operator->(&this->m);
          pMVar5->written = uVar1 + pMVar5->written;
          pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                   operator->(&this->m);
          if ((anonymous_namespace)::memory_limit_ < pMVar5->written) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"PL_Flate memory limit exceeded");
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        pPVar6 = Pipeline::next(&this->super_Pipeline);
        pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        peVar7 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)pMVar5);
        (*pPVar6->_vptr_Pipeline[2])(pPVar6,peVar7,local_58);
        pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        peVar7 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)pMVar5);
        _err[3] = (size_t)peVar7;
        pMVar5 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        uVar2 = QIntC::to_uint<unsigned_long>(&pMVar5->out_bufsize);
        *(uint *)(_err + 4) = uVar2;
      }
    }
    if (local_48 == 1) {
      ready._7_1_ = 1;
      goto LAB_0014e26e;
    }
    checkError(this,"data",local_48);
  } while( true );
}

Assistant:

void
Pl_Flate::handleData(unsigned char const* data, size_t len, int flush)
{
    if (len > UINT_MAX) {
        throw std::runtime_error("Pl_Flate: zlib doesn't support data blocks larger than int");
    }
    z_stream& zstream = *(static_cast<z_stream*>(m->zdata));
    // zlib is known not to modify the data pointed to by next_in but doesn't declare the field
    // value const unless compiled to do so.
    zstream.next_in = const_cast<unsigned char*>(data);
    zstream.avail_in = QIntC::to_uint(len);

    if (!m->initialized) {
        int err = Z_OK;

        // deflateInit and inflateInit are macros that use old-style casts.
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
        if (m->action == a_deflate) {
            err = deflateInit(&zstream, compression_level);
        } else {
            err = inflateInit(&zstream);
        }
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif

        checkError("Init", err);
        m->initialized = true;
    }

    int err = Z_OK;

    bool done = false;
    while (!done) {
        if (m->action == a_deflate) {
            err = deflate(&zstream, flush);
        } else {
            err = inflate(&zstream, flush);
        }
        if ((m->action == a_inflate) && (err != Z_OK) && zstream.msg &&
            (strcmp(zstream.msg, "incorrect data check") == 0)) {
            // Other PDF readers ignore this specific error. Combining this with Z_SYNC_FLUSH
            // enables qpdf to handle some broken zlib streams without losing data.
            err = Z_STREAM_END;
        }
        switch (err) {
        case Z_BUF_ERROR:
            // Probably shouldn't be able to happen, but possible as a boundary condition: if the
            // last call to inflate exactly filled the output buffer, it's possible that the next
            // call to inflate could have nothing to do. There are PDF files in the wild that have
            // this error (including at least one in qpdf's test suite). In some cases, we want to
            // know about this, because it indicates incorrect compression, so call a callback if
            // provided.
            this->warn("input stream is complete but output may still be valid", err);
            done = true;
            break;

        case Z_STREAM_END:
            done = true;
            // fall through

        case Z_OK:
            {
                if ((zstream.avail_in == 0) && (zstream.avail_out > 0)) {
                    // There is nothing left to read, and there was sufficient buffer space to write
                    // everything we needed, so we're done for now.
                    done = true;
                }
                uLong ready = QIntC::to_ulong(m->out_bufsize - zstream.avail_out);
                if (ready > 0) {
                    if (memory_limit_ && m->action != a_deflate) {
                        m->written += ready;
                        if (m->written > memory_limit_) {
                            throw std::runtime_error("PL_Flate memory limit exceeded");
                        }
                    }
                    next()->write(m->outbuf.get(), ready);
                    zstream.next_out = m->outbuf.get();
                    zstream.avail_out = QIntC::to_uint(m->out_bufsize);
                }
            }
            break;

        default:
            this->checkError("data", err);
            break;
        }
    }
}